

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

time_t cab_dos_time(uchar *p)

{
  uint16_t uVar1;
  time_t tVar2;
  undefined1 local_50 [8];
  tm ts;
  wchar_t msDate;
  wchar_t msTime;
  uchar *p_local;
  
  uVar1 = archive_le16dec(p);
  ts.tm_zone._0_4_ = (uint)uVar1;
  uVar1 = archive_le16dec(p + 2);
  ts.tm_zone._4_4_ = (uint)uVar1;
  memset(local_50,0,0x38);
  ts.tm_mday = ((int)(uint)ts.tm_zone >> 9 & 0x7fU) + L'P';
  ts.tm_hour = ((int)(uint)ts.tm_zone >> 5 & 0xfU) + L'\xffffffff';
  ts.tm_min = (uint)ts.tm_zone & 0x1f;
  ts.tm_sec = (int)ts.tm_zone._4_4_ >> 0xb & 0x1f;
  local_50._4_4_ = (int)ts.tm_zone._4_4_ >> 5 & 0x3f;
  local_50._0_4_ = (ts.tm_zone._4_4_ & 0x1f) << 1;
  ts.tm_wday = L'\xffffffff';
  tVar2 = mktime((tm *)local_50);
  return tVar2;
}

Assistant:

static time_t
cab_dos_time(const unsigned char *p)
{
	int msTime, msDate;
	struct tm ts;

	msDate = archive_le16dec(p);
	msTime = archive_le16dec(p+2);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80;   /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1;     /* Month number.     */
	ts.tm_mday = msDate & 0x1f;		    /* Day of month.     */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return (mktime(&ts));
}